

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O0

void __thiscall amrex::CArena::free(CArena *this,void *__ptr)

{
  bool bVar1;
  pointer this_00;
  size_t sVar2;
  size_t sVar3;
  reference pNVar4;
  void *pvVar5;
  _Self *__x;
  void *pvVar6;
  pointer pNVar7;
  reference pNVar8;
  const_iterator __position;
  pair<std::_Rb_tree_const_iterator<amrex::CArena::Node>,_bool> pVar9;
  Node *node_1;
  void *addr;
  iterator hi_it;
  Node *node;
  void *addr_1;
  iterator lo_it;
  iterator free_it;
  pair<std::_Rb_tree_const_iterator<amrex::CArena::Node>,_bool> pair_it;
  iterator busy_it;
  lock_guard<std::mutex> lock;
  unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_fffffffffffffe38;
  unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_fffffffffffffe40;
  set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *this_01;
  _Node_iterator_base<amrex::CArena::Node,_false> in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  value_type *in_stack_fffffffffffffe58;
  set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_fffffffffffffe60;
  bool local_179;
  _Self local_e0;
  void *local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  reference local_b8;
  void *local_b0;
  _Base_ptr local_a8;
  _Self local_a0;
  _Node_iterator_base<amrex::CArena::Node,_false> local_98;
  __node_type *local_90;
  undefined1 local_88 [16];
  undefined1 local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  undefined4 local_5c;
  _Node_iterator_base<amrex::CArena::Node,_false> local_58 [3];
  Node local_40;
  _Node_iterator_base<amrex::CArena::Node,_false> local_28 [2];
  void *local_18;
  CArena *local_10;
  char *local_8;
  
  if (__ptr != (void *)0x0) {
    local_18 = __ptr;
    local_10 = this;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe40,
               (mutex_type *)in_stack_fffffffffffffe38);
    Node::Node(&local_40,local_18,(void *)0x0,0);
    local_28[0]._M_cur =
         (__node_type *)
         std::
         unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
         ::find(in_stack_fffffffffffffe38,(key_type *)0xf972e0);
    local_58[0]._M_cur =
         (__node_type *)
         std::
         unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
         ::end(in_stack_fffffffffffffe38);
    bVar1 = std::__detail::operator==(local_28,local_58);
    if (bVar1) {
      local_8 = "CArena::free: unknown pointer";
      Abort_host(in_stack_fffffffffffffe50);
      local_5c = 1;
    }
    else {
      this_00 = std::__detail::_Node_iterator<amrex::CArena::Node,_true,_false>::operator->
                          ((_Node_iterator<amrex::CArena::Node,_true,_false> *)0xf97399);
      sVar2 = Node::size(this_00);
      this->m_actually_used = this->m_actually_used - sVar2;
      std::__detail::_Node_iterator<amrex::CArena::Node,_true,_false>::operator*
                ((_Node_iterator<amrex::CArena::Node,_true,_false> *)0xf973d6);
      pVar9 = std::
              set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
              ::insert(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_88._0_8_ = pVar9.first._M_node;
      local_78 = pVar9.second;
      local_90 = local_28[0]._M_cur;
      local_88._8_8_ = local_88._0_8_;
      local_70 = (_Base_ptr)local_88._0_8_;
      local_68 = local_78;
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
           ::erase(in_stack_fffffffffffffe40,in_stack_fffffffffffffe48._M_cur);
      local_a0._M_node =
           (_Base_ptr)
           std::
           set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
           ::begin((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                    *)in_stack_fffffffffffffe38);
      bVar1 = std::operator==((_Self *)local_88,&local_a0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_a8 = (_Base_ptr)local_88._0_8_;
        std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator--
                  ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe40);
        pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                            in_stack_fffffffffffffe40);
        pvVar5 = Node::block(pNVar4);
        pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                            in_stack_fffffffffffffe40);
        sVar2 = Node::size(pNVar4);
        local_b0 = (void *)((long)pvVar5 + sVar2);
        pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                            in_stack_fffffffffffffe40);
        pvVar6 = Node::block(pNVar4);
        if ((void *)((long)pvVar5 + sVar2) == pvVar6) {
          pNVar7 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator->
                             ((_Rb_tree_const_iterator<amrex::CArena::Node> *)0xf97564);
          pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                             ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                              in_stack_fffffffffffffe40);
          bVar1 = Node::coalescable(pNVar7,pNVar4);
          if (bVar1) {
            pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                               ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                                in_stack_fffffffffffffe40);
            local_b8 = pNVar4;
            pNVar8 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                               ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                                in_stack_fffffffffffffe40);
            sVar2 = Node::size(pNVar8);
            pNVar8 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                               ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                                in_stack_fffffffffffffe40);
            sVar3 = Node::size(pNVar8);
            Node::size(pNVar4,sVar2 + sVar3);
            local_c0 = (_Base_ptr)local_88._0_8_;
            local_c8 = (_Base_ptr)
                       std::
                       set<amrex::CArena::Node,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                       ::erase_abi_cxx11_((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                                           *)in_stack_fffffffffffffe40,
                                          (const_iterator)in_stack_fffffffffffffe48._M_cur);
            local_88._0_8_ = local_a8;
          }
        }
      }
      local_d0 = (_Base_ptr)local_88._0_8_;
      pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                         ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe40)
      ;
      pvVar5 = Node::block(pNVar4);
      pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                         ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe40)
      ;
      sVar2 = Node::size(pNVar4);
      local_d8 = (void *)((long)pvVar5 + sVar2);
      __x = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator++
                      ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe40);
      local_e0._M_node =
           (_Base_ptr)
           std::
           set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
           ::end((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                  *)in_stack_fffffffffffffe38);
      bVar1 = std::operator!=(__x,&local_e0);
      pvVar5 = local_d8;
      local_179 = false;
      if (bVar1) {
        pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                            in_stack_fffffffffffffe40);
        pvVar6 = Node::block(pNVar4);
        local_179 = false;
        if (pvVar5 == pvVar6) {
          pNVar7 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator->
                             ((_Rb_tree_const_iterator<amrex::CArena::Node> *)0xf97720);
          pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                             ((_Rb_tree_const_iterator<amrex::CArena::Node> *)
                              in_stack_fffffffffffffe40);
          local_179 = Node::coalescable(pNVar7,pNVar4);
        }
      }
      if (local_179 != false) {
        this_01 = (set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                   *)local_88;
        pNVar4 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)this_01);
        pNVar8 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)this_01);
        __position._M_node = (_Base_ptr)Node::size(pNVar8);
        pNVar8 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                           ((_Rb_tree_const_iterator<amrex::CArena::Node> *)this_01);
        sVar2 = Node::size(pNVar8);
        Node::size(pNVar4,(long)&(__position._M_node)->_M_color + sVar2);
        std::
        set<amrex::CArena::Node,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
        ::erase_abi_cxx11_(this_01,__position);
      }
      local_5c = 0;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xf9780a);
  }
  return;
}

Assistant:

void
CArena::free (void* vp)
{
    if (vp == 0) {
        //
        // Allow calls with NULL as allowed by C++ delete.
        //
        return;
    }

    std::lock_guard<std::mutex> lock(carena_mutex);

    //
    // `vp' had better be in the busy list.
    //
    auto busy_it = m_busylist.find(Node(vp,0,0));
    if (busy_it == m_busylist.end()) {
        amrex::Abort("CArena::free: unknown pointer");
        return;
    }
    BL_ASSERT(m_freelist.find(*busy_it) == m_freelist.end());

    m_actually_used -= busy_it->size();

    //
    // Put free'd block on free list and save iterator to insert()ed position.
    //
    std::pair<NL::iterator,bool> pair_it = m_freelist.insert(*busy_it);

    BL_ASSERT(pair_it.second == true);

    NL::iterator free_it = pair_it.first;

    BL_ASSERT(free_it != m_freelist.end() && (*free_it).block() == (*busy_it).block());
    //
    // And remove from busy list.
    //
    m_busylist.erase(busy_it);
    //
    // Coalesce freeblock(s) on lo and hi side of this block.
    //
    if (!(free_it == m_freelist.begin()))
    {
        NL::iterator lo_it = free_it;

        --lo_it;

        void* addr = static_cast<char*>((*lo_it).block()) + (*lo_it).size();

        if (addr == (*free_it).block() && lo_it->coalescable(*free_it))
        {
            //
            // This cast is needed as iterators to set return const values;
            // i.e. we can't legally change an element of a set.
            // In this case I want to change the size() of a block
            // in the freelist.  Since size() is not used in the ordering
            // relations in the set, this won't effect the order;
            // i.e. it won't muck up the ordering of elements in the set.
            // I don't want to have to remove the element from the set and
            // then reinsert it with a different size() as it'll just go
            // back into the same place in the set.
            //
            Node* node = const_cast<Node*>(&(*lo_it));
            BL_ASSERT(!(node == 0));
            node->size((*lo_it).size() + (*free_it).size());
            m_freelist.erase(free_it);
            free_it = lo_it;
        }
    }

    NL::iterator hi_it = free_it;

    void* addr = static_cast<char*>((*free_it).block()) + (*free_it).size();

    if (++hi_it != m_freelist.end() && addr == (*hi_it).block() && hi_it->coalescable(*free_it))
    {
        //
        // Ditto the above comment.
        //
        Node* node = const_cast<Node*>(&(*free_it));
        BL_ASSERT(!(node == 0));
        node->size((*free_it).size() + (*hi_it).size());
        m_freelist.erase(hi_it);
    }
}